

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcp.hpp
# Opt level: O2

void lcp_from_sa<unsigned_long>
               (string *S,vector<unsigned_long,_std::allocator<unsigned_long>_> *SA,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *ISA,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *LCP)

{
  size_type __new_size;
  pointer puVar1;
  ulong uVar2;
  pointer pcVar3;
  unsigned_long uVar4;
  uint __line;
  long lVar5;
  pointer puVar6;
  unsigned_long uVar7;
  ulong uVar8;
  char *__assertion;
  ulong uVar9;
  bool bVar10;
  
  lVar5 = (long)(SA->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(SA->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start;
  __new_size = S->_M_string_length;
  if (__new_size == lVar5 >> 3) {
    if (lVar5 == (long)(ISA->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(ISA->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data._M_start) {
      puVar6 = (LCP->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((long)(LCP->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar6 >> 3 != __new_size) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(LCP,__new_size);
        puVar6 = (LCP->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      }
      *puVar6 = 0;
      puVar1 = (ISA->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar7 = 0;
      for (uVar8 = 0; uVar2 = S->_M_string_length, uVar8 < uVar2; uVar8 = uVar8 + 1) {
        bVar10 = uVar7 == 0;
        uVar7 = uVar7 - 1;
        if (bVar10) {
          uVar7 = 0;
        }
        pcVar3 = (S->_M_dataplus)._M_p;
        for (; (((uVar7 + uVar8 < uVar2 &&
                 (uVar4 = (ISA->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                          _M_impl.super__Vector_impl_data._M_start[uVar8], uVar4 != 0)) &&
                (uVar9 = (SA->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                         _M_impl.super__Vector_impl_data._M_start[uVar4 - 1] + uVar7, uVar9 < uVar2)
                ) && (pcVar3[uVar7 + uVar8] == pcVar3[uVar9])); uVar7 = uVar7 + 1) {
        }
        puVar6[puVar1[uVar8]] = uVar7;
      }
      return;
    }
    __assertion = "SA.size() == ISA.size()";
    __line = 0x30;
  }
  else {
    __assertion = "S.size() == SA.size()";
    __line = 0x2f;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/lcp.hpp"
                ,__line,
                "void lcp_from_sa(const std::string &, const std::vector<index_t> &, const std::vector<index_t> &, std::vector<index_t> &) [index_t = unsigned long]"
               );
}

Assistant:

void lcp_from_sa(const std::string& S, const std::vector<index_t>& SA, const std::vector<index_t>& ISA, std::vector<index_t>& LCP) {
    // TODO: cite the source for this linear O(n) algorithm!

    // input sizes must be equal
    assert(S.size() == SA.size());
    assert(SA.size() == ISA.size());

    // init LCP array if not yet of correct size
    if (LCP.size() != S.size()) {
        LCP.resize(S.size());
    }

    // first LCP is undefined -> set to 0:
    LCP[0] = 0;

    std::size_t h = 0;

    // in string order!
    for (std::size_t i = 0; i < S.size(); ++i) {
        // length of currently equal characters (in string order, next LCP value
        // is always >= current lcp - 1)
        std::size_t k = 0;
        if (h > 0)
            k = h-1;
        // comparing suffix starting from i=SA[ISA[i]] with the previous
        // suffix in SA order: SA[ISA[i]-1]
        while (i+k < S.size() && ISA[i] > 0 && SA[ISA[i]-1]+k < S.size() && S[i+k] == S[SA[ISA[i]-1]+k])
            k++;
        LCP[ISA[i]] = k;
        h = k;
    }
}